

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

int HUF_buildTree(nodeElt *huffNode,U32 maxSymbolValue)

{
  int iVar1;
  int local_48;
  int local_44;
  int n2;
  int n1;
  int nodeRoot;
  int n;
  int nodeNb;
  int lowN;
  int lowS;
  int nonNullRank;
  nodeElt *huffNode0;
  U32 maxSymbolValue_local;
  nodeElt *huffNode_local;
  
  lowN = maxSymbolValue;
  while (huffNode[lowN].count == 0) {
    lowN = lowN + -1;
  }
  iVar1 = lowN + 0xff;
  n = 0x100;
  huffNode[0x100].count = huffNode[lowN].count + huffNode[lowN + -1].count;
  huffNode[lowN + -1].parent = 0x100;
  huffNode[lowN].parent = 0x100;
  nodeNb = lowN + -2;
  nodeRoot = 0x101;
  for (n1 = nodeRoot; n1 <= iVar1; n1 = n1 + 1) {
    huffNode[n1].count = 0x40000000;
  }
  huffNode[-1].count = 0x80000000;
  for (; nodeRoot <= iVar1; nodeRoot = nodeRoot + 1) {
    if (huffNode[nodeNb].count < huffNode[n].count) {
      local_44 = nodeNb;
      nodeNb = nodeNb + -1;
    }
    else {
      local_44 = n;
      n = n + 1;
    }
    if (huffNode[nodeNb].count < huffNode[n].count) {
      local_48 = nodeNb;
      nodeNb = nodeNb + -1;
    }
    else {
      local_48 = n;
      n = n + 1;
    }
    huffNode[nodeRoot].count = huffNode[local_44].count + huffNode[local_48].count;
    huffNode[local_48].parent = (U16)nodeRoot;
    huffNode[local_44].parent = (U16)nodeRoot;
  }
  huffNode[iVar1].nbBits = '\0';
  for (n1 = lowN + 0xfe; 0xff < n1; n1 = n1 + -1) {
    huffNode[n1].nbBits = huffNode[huffNode[n1].parent].nbBits + '\x01';
  }
  for (n1 = 0; n1 <= lowN; n1 = n1 + 1) {
    huffNode[n1].nbBits = huffNode[huffNode[n1].parent].nbBits + '\x01';
  }
  return lowN;
}

Assistant:

static int HUF_buildTree(nodeElt* huffNode, U32 maxSymbolValue)
{
    nodeElt* const huffNode0 = huffNode - 1;
    int nonNullRank;
    int lowS, lowN;
    int nodeNb = STARTNODE;
    int n, nodeRoot;
    DEBUGLOG(5, "HUF_buildTree (alphabet size = %u)", maxSymbolValue + 1);
    /* init for parents */
    nonNullRank = (int)maxSymbolValue;
    while(huffNode[nonNullRank].count == 0) nonNullRank--;
    lowS = nonNullRank; nodeRoot = nodeNb + lowS - 1; lowN = nodeNb;
    huffNode[nodeNb].count = huffNode[lowS].count + huffNode[lowS-1].count;
    huffNode[lowS].parent = huffNode[lowS-1].parent = (U16)nodeNb;
    nodeNb++; lowS-=2;
    for (n=nodeNb; n<=nodeRoot; n++) huffNode[n].count = (U32)(1U<<30);
    huffNode0[0].count = (U32)(1U<<31);  /* fake entry, strong barrier */

    /* create parents */
    while (nodeNb <= nodeRoot) {
        int const n1 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        int const n2 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        huffNode[nodeNb].count = huffNode[n1].count + huffNode[n2].count;
        huffNode[n1].parent = huffNode[n2].parent = (U16)nodeNb;
        nodeNb++;
    }

    /* distribute weights (unlimited tree height) */
    huffNode[nodeRoot].nbBits = 0;
    for (n=nodeRoot-1; n>=STARTNODE; n--)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;
    for (n=0; n<=nonNullRank; n++)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;

    DEBUGLOG(6, "Initial distribution of bits completed (%zu sorted symbols)", showHNodeBits(huffNode, maxSymbolValue+1));

    return nonNullRank;
}